

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuadrature.cpp
# Opt level: O2

void __thiscall
chrono::ChQuadratureTablesTetrahedron::ChQuadratureTablesTetrahedron
          (ChQuadratureTablesTetrahedron *this)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_01;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_02;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<double> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  initializer_list<double> __l_08;
  initializer_list<double> __l_09;
  initializer_list<double> __l_10;
  initializer_list<double> __l_11;
  initializer_list<double> __l_12;
  initializer_list<double> __l_13;
  initializer_list<double> __l_14;
  initializer_list<double> __l_15;
  initializer_list<double> __l_16;
  initializer_list<double> __l_17;
  initializer_list<double> __l_18;
  allocator_type local_109;
  vector<double,_std::allocator<double>_> wt;
  vector<double,_std::allocator<double>_> za;
  vector<double,_std::allocator<double>_> wt_1;
  vector<double,_std::allocator<double>_> ya;
  vector<double,_std::allocator<double>_> xa;
  
  this_00 = &this->LrootsU;
  this_01 = &this->LrootsV;
  this_02 = &this->LrootsW;
  (this->LrootsU).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LrootsU).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LrootsV).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LrootsV).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LrootsV).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LrootsW).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LrootsW).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LrootsW).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Weight).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Weight).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Weight).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LrootsU).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LrootsU).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LrootsU).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LrootsV).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LrootsV).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fd0000000000000;
  __l._M_len = 1;
  __l._M_array = (iterator)&ya;
  std::vector<double,_std::allocator<double>_>::vector(&xa,__l,(allocator_type *)&za);
  za.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fd0000000000000;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&za;
  std::vector<double,_std::allocator<double>_>::vector(&ya,__l_00,(allocator_type *)&wt);
  wt.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fd0000000000000;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&wt;
  std::vector<double,_std::allocator<double>_>::vector(&za,__l_01,(allocator_type *)&wt_1);
  wt_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&DAT_3ff0000000000000;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&wt_1;
  std::vector<double,_std::allocator<double>_>::vector(&wt,__l_02,&local_109);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_00,&xa);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_01,&ya);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_02,&za);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->Weight,&wt);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&wt.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&za.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ya.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&xa.super__Vector_base<double,_std::allocator<double>_>);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fe2bbae2a27f932;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fc1b06d1d200913;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fc1b06d1d200913;
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&ya,__l_03,(allocator_type *)&za);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fc1b06d1d200913;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fc1b06d1d200913;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fc1b06d1d200913;
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&za,__l_04,(allocator_type *)&wt);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fc1b06d1d200913;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fc1b06d1d200913;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fe2bbae2a27f932;
  __l_05._M_len = 4;
  __l_05._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&wt,__l_05,(allocator_type *)&wt_1);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fd0000000000000;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fd0000000000000;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fd0000000000000;
  __l_06._M_len = 4;
  __l_06._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&wt_1,__l_06,&local_109);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_00,&ya);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_01,&za);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_02,&wt);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->Weight,&wt_1);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&wt_1.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&wt.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&za.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ya.super__Vector_base<double,_std::allocator<double>_>);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fd0000000000000;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fe0000000000000;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fc5555555555557;
  __l_07._M_len = 5;
  __l_07._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&ya,__l_07,(allocator_type *)&za);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fd0000000000000;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fc5555555555557;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fc5555555555557;
  __l_08._M_len = 5;
  __l_08._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&za,__l_08,(allocator_type *)&wt);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fd0000000000000;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fc5555555555557;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fc5555555555557;
  __l_09._M_len = 5;
  __l_09._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&wt,__l_09,(allocator_type *)&wt_1);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0xbfe999999999999a;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fdccccccccccccd;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fdccccccccccccd;
  __l_10._M_len = 5;
  __l_10._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&wt_1,__l_10,&local_109);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_00,&ya);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_01,&za);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_02,&wt);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->Weight,&wt_1);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&wt_1.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&wt.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&za.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ya.super__Vector_base<double,_std::allocator<double>_>);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fd0000000000000;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fe9249249249249;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fb2492492492490;
  __l_11._M_len = 0xb;
  __l_11._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&ya,__l_11,(allocator_type *)&za);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fd0000000000000;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fb2492492492490;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fb2492492492490;
  __l_12._M_len = 0xb;
  __l_12._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&za,__l_12,(allocator_type *)&wt);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fd0000000000000;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fb2492492492490;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fb2492492492490;
  __l_13._M_len = 0xb;
  __l_13._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&wt,__l_13,(allocator_type *)&wt_1);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0xbfb434f9953b1e70;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fa76a5c0601e951;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fa76a5c0601e951;
  __l_14._M_len = 0xb;
  __l_14._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&wt_1,__l_14,&local_109);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_00,&ya);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_01,&za);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_02,&wt);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->Weight,&wt_1);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&wt_1.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&wt.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&za.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ya.super__Vector_base<double,_std::allocator<double>_>);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fd0000000000000;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fd5555555555555;
  __l_15._M_len = 0xf;
  __l_15._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&ya,__l_15,(allocator_type *)&za);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fd0000000000000;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fd5555555555555;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fd5555555555555;
  __l_16._M_len = 0xf;
  __l_16._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&za,__l_16,(allocator_type *)&wt);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fd0000000000000;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fd5555555555555;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fd5555555555555;
  __l_17._M_len = 0xf;
  __l_17._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&wt,__l_17,(allocator_type *)&wt_1);
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3fc742036d16b98b;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3fa283a83a83a83d;
  xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fa283a83a83a83d;
  __l_18._M_len = 0xf;
  __l_18._M_array = (iterator)&xa;
  std::vector<double,_std::allocator<double>_>::vector(&wt_1,__l_18,&local_109);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_00,&ya);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_01,&za);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(this_02,&wt);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->Weight,&wt_1);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&wt_1.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&wt.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&za.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ya.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

ChQuadratureTablesTetrahedron::ChQuadratureTablesTetrahedron() {
    // initialize table with precomputed weights and coordinates
    {  // i=0: 1pt  deg 1
        std::vector<double> xa= {0.25}; 
        std::vector<double> ya= {0.25};
        std::vector<double> za= {0.25};
        std::vector<double> wt= {1};
        this->LrootsU.push_back(xa);
        this->LrootsV.push_back(ya);
        this->LrootsW.push_back(za);
        this->Weight.push_back(wt);
    }
    {  // i=1: 4pt  deg 2
        std::vector<double> xa= {0.5854101966249685, 0.1381966011250105, 0.1381966011250105, 0.1381966011250105}; 
        std::vector<double> ya= {0.1381966011250105, 0.1381966011250105, 0.1381966011250105, 0.5854101966249685};
        std::vector<double> za= {0.1381966011250105, 0.1381966011250105, 0.5854101966249685, 0.1381966011250105};
        std::vector<double> wt= {0.2500000000000000, 0.2500000000000000, 0.2500000000000000, 0.2500000000000000};
        this->LrootsU.push_back(xa);
        this->LrootsV.push_back(ya);
        this->LrootsW.push_back(za);
        this->Weight.push_back(wt);
    }
    {   // i=2: 5pt  deg 3
        std::vector<double> xa= {0.2500000000000000, 0.5000000000000000, 0.1666666666666667, 0.1666666666666667, 0.1666666666666667};
        std::vector<double> ya= { 0.2500000000000000, 0.1666666666666667, 0.1666666666666667, 0.1666666666666667, 0.5000000000000000};
        std::vector<double> za= { 0.2500000000000000, 0.1666666666666667, 0.1666666666666667, 0.5000000000000000, 0.1666666666666667};
        std::vector<double> wt= {-0.8000000000000000, 0.4500000000000000, 0.4500000000000000, 0.4500000000000000, 0.4500000000000000};
        this->LrootsU.push_back(xa);
        this->LrootsV.push_back(ya);
        this->LrootsW.push_back(za);
        this->Weight.push_back(wt);
    }
    {   // i=3: 11pt  deg 4
        std::vector<double> xa= {0.2500000000000000, 0.7857142857142857, 0.0714285714285714, 0.0714285714285714, 0.0714285714285714, 0.1005964238332008, 0.3994035761667992, 0.3994035761667992, 0.3994035761667992, 0.1005964238332008, 0.1005964238332008};
        std::vector<double> ya= {0.2500000000000000, 0.0714285714285714, 0.0714285714285714, 0.0714285714285714, 0.7857142857142857, 0.3994035761667992, 0.1005964238332008, 0.3994035761667992, 0.1005964238332008, 0.3994035761667992, 0.1005964238332008};
        std::vector<double> za= {0.2500000000000000, 0.0714285714285714, 0.0714285714285714, 0.7857142857142857, 0.0714285714285714, 0.3994035761667992, 0.3994035761667992, 0.1005964238332008, 0.1005964238332008, 0.1005964238332008, 0.3994035761667992};
        std::vector<double> wt= {-0.0789333333333333, 0.0457333333333333, 0.0457333333333333, 0.0457333333333333, 0.0457333333333333, 0.1493333333333333, 0.1493333333333333, 0.1493333333333333, 0.1493333333333333, 0.1493333333333333, 0.1493333333333333};
        this->LrootsU.push_back(xa);
        this->LrootsV.push_back(ya);
        this->LrootsW.push_back(za);
        this->Weight.push_back(wt);
    }
    {   // i=4: 15 pt
        std::vector<double> xa={0.2500000000000000, 0.0000000000000000, 0.3333333333333333, 0.3333333333333333, 0.3333333333333333, 0.7272727272727273, 0.0909090909090909, 0.0909090909090909, 0.0909090909090909, 0.4334498464263357, 0.0665501535736643, 0.0665501535736643, 0.0665501535736643, 0.4334498464263357, 0.4334498464263357};
        std::vector<double> ya={0.2500000000000000, 0.3333333333333333, 0.3333333333333333, 0.3333333333333333, 0.0000000000000000, 0.0909090909090909, 0.0909090909090909, 0.0909090909090909, 0.7272727272727273, 0.0665501535736643, 0.4334498464263357, 0.0665501535736643, 0.4334498464263357, 0.0665501535736643, 0.4334498464263357};
        std::vector<double> za={0.2500000000000000, 0.3333333333333333, 0.3333333333333333, 0.0000000000000000, 0.3333333333333333, 0.0909090909090909, 0.0909090909090909, 0.7272727272727273, 0.0909090909090909, 0.0665501535736643, 0.0665501535736643, 0.4334498464263357, 0.4334498464263357, 0.4334498464263357, 0.0665501535736643};
        std::vector<double> wt={0.1817020685825351, 0.0361607142857143, 0.0361607142857143, 0.0361607142857143, 0.0361607142857143, 0.0698714945161738, 0.0698714945161738, 0.0698714945161738, 0.0698714945161738, 0.0656948493683187, 0.0656948493683187, 0.0656948493683187, 0.0656948493683187, 0.0656948493683187, 0.0656948493683187};
        this->LrootsU.push_back(xa);
        this->LrootsV.push_back(ya);
        this->LrootsW.push_back(za);
        this->Weight.push_back(wt);
    }
}